

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserValidationErrorTest_Proto3JsonConflictError_Test::
TestBody(ParserValidationErrorTest_Proto3JsonConflictError_Test *this)

{
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_38
  ;
  string_view local_20;
  ParserValidationErrorTest_Proto3JsonConflictError_Test *local_10;
  ParserValidationErrorTest_Proto3JsonConflictError_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,
             "syntax = \'proto3\';\nmessage TestMessage {\n  uint32 _foo = 1;\n  uint32 Foo = 2;\n}\n"
            );
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_38,
            "3:9: The default JSON name of field \"Foo\" (\"Foo\") conflicts with the default JSON name of field \"_foo\".\n"
           );
  ParserTest::ExpectHasValidationErrors(&this->super_ParserValidationErrorTest,local_20,&local_38);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_38);
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, Proto3JsonConflictError) {
  ExpectHasValidationErrors(
      "syntax = 'proto3';\n"
      "message TestMessage {\n"
      "  uint32 _foo = 1;\n"
      "  uint32 Foo = 2;\n"
      "}\n",
      "3:9: The default JSON name of field \"Foo\" (\"Foo\") conflicts "
      "with the default JSON name of field \"_foo\".\n");
}